

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O0

RTPRandom * __thiscall jrtplib::RTPSession::GetRandomNumberGenerator(RTPSession *this,RTPRandom *r)

{
  RTPRandom *local_20;
  RTPRandom *rnew;
  RTPRandom *r_local;
  RTPSession *this_local;
  
  if (r == (RTPRandom *)0x0) {
    local_20 = RTPRandom::CreateDefaultRandomNumberGenerator();
    this->deletertprnd = true;
  }
  else {
    this->deletertprnd = false;
    local_20 = r;
  }
  return local_20;
}

Assistant:

RTPRandom *RTPSession::GetRandomNumberGenerator(RTPRandom *r)
{
	RTPRandom *rnew = 0;

	if (r == 0)
	{
		rnew = RTPRandom::CreateDefaultRandomNumberGenerator();
		deletertprnd = true;
	}
	else
	{
		rnew = r;
		deletertprnd = false;
	}

	return rnew;
}